

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O2

void start_pass(j_decompress_ptr cinfo)

{
  double dVar1;
  int iVar2;
  J_DCT_METHOD JVar3;
  jpeg_inverse_dct *pjVar4;
  JQUANT_TBL *pJVar5;
  void *pvVar6;
  jpeg_error_mgr *pjVar7;
  int iVar8;
  int row;
  long lVar9;
  code *pcVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  jpeg_component_info *pjVar14;
  
  pjVar14 = cinfo->comp_info;
  pjVar4 = cinfo->idct;
  lVar13 = 0;
  pcVar10 = (inverse_DCT_method_ptr)0x0;
  iVar8 = 0;
  do {
    if (cinfo->num_components <= lVar13) {
      return;
    }
    iVar2 = pjVar14->DCT_scaled_size;
    switch(iVar2) {
    case 1:
      pcVar10 = jpeg_idct_1x1;
      break;
    case 2:
      iVar8 = jsimd_can_idct_2x2();
      pcVar10 = jsimd_idct_2x2;
      if (iVar8 == 0) {
        pcVar10 = jpeg_idct_2x2;
      }
      goto LAB_0013caad;
    case 3:
      pcVar10 = jpeg_idct_3x3;
      break;
    case 4:
      iVar8 = jsimd_can_idct_4x4();
      pcVar10 = jsimd_idct_4x4;
      if (iVar8 == 0) {
        pcVar10 = jpeg_idct_4x4;
      }
LAB_0013caad:
      iVar8 = 0;
      goto LAB_0013caf0;
    case 5:
      pcVar10 = jpeg_idct_5x5;
      break;
    case 6:
      pcVar10 = jpeg_idct_6x6;
      break;
    case 7:
      pcVar10 = jpeg_idct_7x7;
      break;
    case 8:
      JVar3 = cinfo->dct_method;
      if (JVar3 == JDCT_FLOAT) {
        iVar8 = jsimd_can_idct_float();
        pcVar10 = jsimd_idct_float;
        if (iVar8 == 0) {
          pcVar10 = jpeg_idct_float;
        }
        iVar8 = 2;
      }
      else if (JVar3 == JDCT_IFAST) {
        iVar8 = jsimd_can_idct_ifast();
        pcVar10 = jsimd_idct_ifast;
        if (iVar8 == 0) {
          pcVar10 = jpeg_idct_ifast;
        }
        iVar8 = 1;
      }
      else {
        if (JVar3 == JDCT_ISLOW) {
          iVar8 = jsimd_can_idct_islow();
          pcVar10 = jsimd_idct_islow;
          if (iVar8 == 0) {
            pcVar10 = jpeg_idct_islow;
          }
          goto LAB_0013caad;
        }
        pjVar7 = cinfo->err;
        pjVar7->msg_code = 0x30;
        (*pjVar7->error_exit)((j_common_ptr)cinfo);
      }
      goto LAB_0013caf0;
    case 9:
      pcVar10 = jpeg_idct_9x9;
      break;
    case 10:
      pcVar10 = jpeg_idct_10x10;
      break;
    case 0xb:
      pcVar10 = jpeg_idct_11x11;
      break;
    case 0xc:
      pcVar10 = jpeg_idct_12x12;
      break;
    case 0xd:
      pcVar10 = jpeg_idct_13x13;
      break;
    case 0xe:
      pcVar10 = jpeg_idct_14x14;
      break;
    case 0xf:
      pcVar10 = jpeg_idct_15x15;
      break;
    case 0x10:
      pcVar10 = jpeg_idct_16x16;
      break;
    default:
      pjVar7 = cinfo->err;
      pjVar7->msg_code = 7;
      (pjVar7->msg_parm).i[0] = iVar2;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      goto LAB_0013caf0;
    }
    iVar8 = 0;
LAB_0013caf0:
    pjVar4->inverse_DCT[lVar13] = pcVar10;
    if (((pjVar14->component_needed != 0) &&
        (*(int *)((long)pjVar4[1].inverse_DCT + lVar13 * 4 + -8) != iVar8)) &&
       (pJVar5 = pjVar14->quant_table, pJVar5 != (JQUANT_TBL *)0x0)) {
      *(int *)((long)pjVar4[1].inverse_DCT + lVar13 * 4 + -8) = iVar8;
      pvVar6 = pjVar14->dct_table;
      lVar9 = 0;
      if (iVar8 == 0) {
        for (; lVar9 != 0x40; lVar9 = lVar9 + 1) {
          *(UINT16 *)((long)pvVar6 + lVar9 * 2) = pJVar5->quantval[lVar9];
        }
      }
      else if (iVar8 == 1) {
        for (; lVar9 != 0x80; lVar9 = lVar9 + 2) {
          *(short *)((long)pvVar6 + lVar9) =
               (short)((int)*(short *)((long)start_pass::aanscales + lVar9) *
                       (uint)*(ushort *)((long)pJVar5->quantval + lVar9) + 0x800 >> 0xc);
        }
      }
      else {
        lVar11 = 0;
        for (; lVar9 != 8; lVar9 = lVar9 + 1) {
          dVar1 = start_pass::aanscalefactor[lVar9];
          lVar11 = (long)(int)lVar11;
          for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 8) {
            *(float *)((long)pvVar6 + lVar11 * 4) =
                 (float)((double)pJVar5->quantval[lVar11] * dVar1 *
                        *(double *)((long)start_pass::aanscalefactor + lVar12));
            lVar11 = lVar11 + 1;
          }
        }
      }
    }
    lVar13 = lVar13 + 1;
    pjVar14 = pjVar14 + 1;
  } while( true );
}

Assistant:

METHODDEF(void)
start_pass(j_decompress_ptr cinfo)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  int ci, tbl;
  jpeg_component_info *compptr;

  if (cinfo->progressive_mode) {
    /* Validate progressive scan parameters */
    if (cinfo->Ss == 0) {
      if (cinfo->Se != 0)
        goto bad;
    } else {
      /* need not check Ss/Se < 0 since they came from unsigned bytes */
      if (cinfo->Se < cinfo->Ss || cinfo->Se > DCTSIZE2 - 1)
        goto bad;
      /* AC scans may have only one component */
      if (cinfo->comps_in_scan != 1)
        goto bad;
    }
    if (cinfo->Ah != 0) {
      /* Successive approximation refinement scan: must have Al = Ah-1. */
      if (cinfo->Ah - 1 != cinfo->Al)
        goto bad;
    }
    if (cinfo->Al > 13) {       /* need not check for < 0 */
bad:
      ERREXIT4(cinfo, JERR_BAD_PROGRESSION,
               cinfo->Ss, cinfo->Se, cinfo->Ah, cinfo->Al);
    }
    /* Update progression status, and verify that scan order is legal.
     * Note that inter-scan inconsistencies are treated as warnings
     * not fatal errors ... not clear if this is right way to behave.
     */
    for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
      int coefi, cindex = cinfo->cur_comp_info[ci]->component_index;
      int *coef_bit_ptr = &cinfo->coef_bits[cindex][0];
      int *prev_coef_bit_ptr =
        &cinfo->coef_bits[cindex + cinfo->num_components][0];
      if (cinfo->Ss && coef_bit_ptr[0] < 0) /* AC without prior DC scan */
        WARNMS2(cinfo, JWRN_BOGUS_PROGRESSION, cindex, 0);
      for (coefi = MIN(cinfo->Ss, 1); coefi <= MAX(cinfo->Se, 9); coefi++) {
        if (cinfo->input_scan_number > 1)
          prev_coef_bit_ptr[coefi] = coef_bit_ptr[coefi];
        else
          prev_coef_bit_ptr[coefi] = 0;
      }
      for (coefi = cinfo->Ss; coefi <= cinfo->Se; coefi++) {
        int expected = (coef_bit_ptr[coefi] < 0) ? 0 : coef_bit_ptr[coefi];
        if (cinfo->Ah != expected)
          WARNMS2(cinfo, JWRN_BOGUS_PROGRESSION, cindex, coefi);
        coef_bit_ptr[coefi] = cinfo->Al;
      }
    }
    /* Select MCU decoding routine */
    if (cinfo->Ah == 0) {
      if (cinfo->Ss == 0)
        entropy->pub.decode_mcu = decode_mcu_DC_first;
      else
        entropy->pub.decode_mcu = decode_mcu_AC_first;
    } else {
      if (cinfo->Ss == 0)
        entropy->pub.decode_mcu = decode_mcu_DC_refine;
      else
        entropy->pub.decode_mcu = decode_mcu_AC_refine;
    }
  } else {
    /* Check that the scan parameters Ss, Se, Ah/Al are OK for sequential JPEG.
     * This ought to be an error condition, but we make it a warning.
     */
    if (cinfo->Ss != 0 || cinfo->Ah != 0 || cinfo->Al != 0 ||
        (cinfo->Se < DCTSIZE2 && cinfo->Se != DCTSIZE2 - 1))
      WARNMS(cinfo, JWRN_NOT_SEQUENTIAL);
    /* Select MCU decoding routine */
    entropy->pub.decode_mcu = decode_mcu;
  }

  /* Allocate & initialize requested statistics areas */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    if (!cinfo->progressive_mode || (cinfo->Ss == 0 && cinfo->Ah == 0)) {
      tbl = compptr->dc_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
        ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->dc_stats[tbl] == NULL)
        entropy->dc_stats[tbl] = (unsigned char *)(*cinfo->mem->alloc_small)
          ((j_common_ptr)cinfo, JPOOL_IMAGE, DC_STAT_BINS);
      MEMZERO(entropy->dc_stats[tbl], DC_STAT_BINS);
      /* Initialize DC predictions to 0 */
      entropy->last_dc_val[ci] = 0;
      entropy->dc_context[ci] = 0;
    }
    if (!cinfo->progressive_mode || cinfo->Ss) {
      tbl = compptr->ac_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
        ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->ac_stats[tbl] == NULL)
        entropy->ac_stats[tbl] = (unsigned char *)(*cinfo->mem->alloc_small)
          ((j_common_ptr)cinfo, JPOOL_IMAGE, AC_STAT_BINS);
      MEMZERO(entropy->ac_stats[tbl], AC_STAT_BINS);
    }
  }

  /* Initialize arithmetic decoding variables */
  entropy->c = 0;
  entropy->a = 0;
  entropy->ct = -16;    /* force reading 2 initial bytes to fill C */
  entropy->pub.insufficient_data = FALSE;

  /* Initialize restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;
}